

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O3

void __thiscall
matchit::impl::Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>::Id
          (Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *this,
          Id<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> *id)

{
  Overload<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1320:44),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_BowenFu[P]mathiu_build_O3__deps_matchit_src_include_matchit_h:1321:44)>
  local_49;
  undefined1 local_48 [8];
  _Variant_storage<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  local_40;
  __index_type local_20;
  
  local_48 = (undefined1  [8])((ulong)local_48 & 0xffffffff00000000);
  local_40._M_u._M_rest._M_rest =
       (_Variadic_union<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
        )0x0;
  local_40._M_u._8_8_ = 0;
  local_40._M_u._16_8_ = 0;
  local_40._M_index = '\0';
  local_40._25_7_ = 0;
  *(undefined4 *)
   &(this->mBlock).
    super__Variant_base<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
    .
    super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
    .
    super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
    .
    super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
    .
    super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
    .
    super__Variant_storage_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
       = 0;
  std::__detail::__variant::
  _Move_ctor_base<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  ::_Move_ctor_base((_Move_ctor_base<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
                     *)((long)&(this->mBlock).
                               super__Variant_base<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                               .
                               super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                               .
                               super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                               .
                               super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                               .
                               super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                               .
                               super__Variant_storage_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                       + 8),(_Move_ctor_base<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
                             *)&local_40);
  *(__index_type *)
   ((long)&(this->mBlock).
           super__Variant_base<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
           .
           super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
           .
           super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
           .
           super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
           .
           super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
           .
           super__Variant_storage_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
   + 0x28) = '\0';
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>,_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*,_const_std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_*>
  ::~_Variant_storage(&local_40);
  local_48 = (undefined1  [8])
             std::
             visit<matchit::impl::Overload<matchit::impl::Id<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>::block()const::_lambda(matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>&)_1_,matchit::impl::Id<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>::block()const::_lambda(matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*)_1_>,std::variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>&>
                       (&local_49,&id->mBlock);
  local_20 = '\x01';
  if (*(__index_type *)
       ((long)&(this->mBlock).
               super__Variant_base<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
               .
               super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
               .
               super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
               .
               super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
               .
               super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
               .
               super__Variant_storage_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
       + 0x28) == '\x01') {
    *(undefined1 (*) [8])
     &(this->mBlock).
      super__Variant_base<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
      .
      super__Move_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
      .
      super__Copy_assign_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
      .
      super__Move_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
      .
      super__Copy_ctor_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
      .
      super__Variant_storage_alias<matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
         = local_48;
  }
  else {
    std::
    variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
    ::
    emplace<1ul,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
              ((variant<matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>,matchit::impl::IdBlock<std::pair<std::shared_ptr<mathiu::impl::Expr_const>,bool>>*>
                *)this,(IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_> **)
                       local_48);
  }
  std::__detail::__variant::
  _Variant_storage<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
  ::~_Variant_storage((_Variant_storage<false,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>,_matchit::impl::IdBlock<std::pair<std::shared_ptr<const_mathiu::impl::Expr>,_bool>_>_*>
                       *)local_48);
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }